

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

UniformGridMediumProvider *
pbrt::UniformGridMediumProvider::Create
          (ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  RGBColorSpace *cs;
  int nx_00;
  int ny_00;
  int nz_00;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  UniformGridMediumProvider *pUVar3;
  ulong uVar4;
  char *message;
  pointer pRVar5;
  Float FVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  span<const_float> v;
  span<const_pbrt::RGBUnboundedSpectrum> v_00;
  span<const_float> v_01;
  span<const_float> v_02;
  Point3f PVar13;
  allocator<char> local_1d9;
  Allocator local_1d8;
  SpectrumHandle Le;
  vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_> rgbSpectrumDensity
  ;
  Point3<float> local_190;
  int local_180;
  int local_17c;
  int local_178;
  int nz;
  int ny;
  int nx;
  optional<pbrt::SampledGrid<float>_> densityGrid;
  SampledGrid<float> LeGrid;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> rgbDensity;
  vector<float,_std::allocator<float>_> LeScale;
  vector<float,_std::allocator<float>_> density;
  RGBColorSpace *colorSpace;
  size_t nDensity;
  Allocator alloc_local;
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> rgbDensityGrid;
  Tuple3<pbrt::Point3,_float> local_60;
  Tuple3<pbrt::Point3,_float> local_50;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_40;
  undefined8 local_38;
  undefined1 auVar12 [56];
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&densityGrid,"density",(allocator<char> *)&rgbDensityGrid);
  ParameterDictionary::GetFloatArray(&density,parameters,(string *)&densityGrid);
  std::__cxx11::string::~string((string *)&densityGrid);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&densityGrid,"density",(allocator<char> *)&rgbDensityGrid);
  ParameterDictionary::GetRGBArray(&rgbDensity,parameters,(string *)&densityGrid);
  std::__cxx11::string::~string((string *)&densityGrid);
  if (density.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      density.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_start ==
        rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      message = "No \"density\" values provided for uniform grid medium.";
      goto LAB_0031ef4e;
    }
  }
  else if (rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
           super__Vector_impl_data._M_start !=
           rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    message = "Both \"float\" and \"rgb\" \"density\" values were provided.";
LAB_0031ef4e:
    ErrorExit(loc,message);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&densityGrid,"nx",(allocator<char> *)&rgbDensityGrid);
  nx_00 = ParameterDictionary::GetOneInt(parameters,(string *)&densityGrid,1);
  std::__cxx11::string::~string((string *)&densityGrid);
  nx = nx_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&densityGrid,"ny",(allocator<char> *)&rgbDensityGrid);
  ny_00 = ParameterDictionary::GetOneInt(parameters,(string *)&densityGrid,1);
  std::__cxx11::string::~string((string *)&densityGrid);
  ny = ny_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&densityGrid,"nz",(allocator<char> *)&rgbDensityGrid);
  nz_00 = ParameterDictionary::GetOneInt(parameters,(string *)&densityGrid,1);
  std::__cxx11::string::~string((string *)&densityGrid);
  if (density.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      density.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    nDensity = ((long)rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0xc;
  }
  else {
    nDensity = (long)density.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)density.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  }
  densityGrid.optionalValue._0_4_ = nx_00 * nz_00 * ny_00;
  nz = nz_00;
  if (nDensity != (long)(int)densityGrid.optionalValue._0_4_) {
    ErrorExit<unsigned_long&,int>
              (loc,"Uniform grid medium has %d density values; expected nx*ny*nz = %d",&nDensity,
               (int *)&densityGrid);
  }
  cs = parameters->colorSpace;
  densityGrid.set = false;
  rgbDensityGrid.set = false;
  colorSpace = cs;
  if (density.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      density.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    rgbSpectrumDensity.
    super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rgbSpectrumDensity.
    super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rgbSpectrumDensity.
    super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.memoryResource = alloc.memoryResource;
    local_180 = nz_00;
    local_17c = ny_00;
    local_178 = nx_00;
    for (pRVar5 = rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                  super__Vector_impl_data._M_start; nx_00 = local_178, ny_00 = local_17c,
        nz_00 = local_180, alloc.memoryResource = local_1d8.memoryResource,
        pRVar5 != rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                  super__Vector_impl_data._M_finish; pRVar5 = pRVar5 + 1) {
      LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = pRVar5->b;
      LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)pRVar5;
      RGBUnboundedSpectrum::RGBUnboundedSpectrum((RGBUnboundedSpectrum *)&LeGrid,cs,(RGB *)&LeScale)
      ;
      std::vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>::
      emplace_back<pbrt::RGBUnboundedSpectrum>(&rgbSpectrumDensity,(RGBUnboundedSpectrum *)&LeGrid);
    }
    v_00.n = (long)rgbSpectrumDensity.
                   super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)rgbSpectrumDensity.
                   super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    v_00.ptr = rgbSpectrumDensity.
               super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start;
    SampledGrid<pbrt::RGBUnboundedSpectrum>::SampledGrid
              ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)&LeGrid,v_00,local_178,local_17c,local_180
               ,local_1d8);
    pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator=
              (&rgbDensityGrid,(SampledGrid<pbrt::RGBUnboundedSpectrum> *)&LeGrid);
    pstd::
    vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
    ::~vector((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
               *)&LeGrid);
    std::_Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>::
    ~_Vector_base(&rgbSpectrumDensity.
                   super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>
                 );
  }
  else {
    v.n = (long)density.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)density.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    v.ptr = density.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    SampledGrid<float>::SampledGrid(&LeGrid,v,nx_00,ny_00,nz_00,alloc);
    pstd::optional<pbrt::SampledGrid<float>_>::operator=(&densityGrid,&LeGrid);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&LeGrid.values);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&LeGrid,"Le",(allocator<char> *)&rgbSpectrumDensity);
  local_38 = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)&LeGrid,
             (SpectrumType)&local_38,(Allocator)0x2);
  std::__cxx11::string::~string((string *)&LeGrid);
  if (Le.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits != 0) {
    FVar6 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
            ::Dispatch<pbrt::SpectrumHandle::MaxValue()const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                        *)&Le);
    if ((FVar6 != 0.0) || (NAN(FVar6))) {
      local_40 = Le.
                 super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                 .bits;
      FVar6 = SpectrumToPhotometric((SpectrumHandle *)&local_40);
      fVar7 = 1.0 / FVar6;
      goto LAB_0031ec7c;
    }
  }
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
  fVar7 = 1.0;
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  Le.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(CONCAT44(extraout_var,iVar1) | 0x1000000000000);
LAB_0031ec7c:
  LeGrid.values.nStored = 0;
  local_1d8.memoryResource._0_4_ = fVar7;
  LeGrid.values.ptr = (float *)0x0;
  LeGrid.values.nAlloc = 0;
  LeGrid.values.alloc.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rgbSpectrumDensity,"Lescale",(allocator<char> *)&local_190);
  ParameterDictionary::GetFloatArray(&LeScale,parameters,(string *)&rgbSpectrumDensity);
  auVar9._0_8_ = std::__cxx11::string::~string((string *)&rgbSpectrumDensity);
  auVar9._8_56_ = extraout_var_00;
  if (LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (pointer)CONCAT44(LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_,
                        LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_4_)) {
    auVar12 = (undefined1  [56])0x0;
    local_190.super_Tuple3<pbrt::Point3,_float>.x = local_1d8.memoryResource._0_4_;
    v_02.n = 1;
    v_02.ptr = (float *)&local_190;
    SampledGrid<float>::SampledGrid((SampledGrid<float> *)&rgbSpectrumDensity,v_02,1,1,1,alloc);
    SampledGrid<float>::operator=(&LeGrid,(SampledGrid<float> *)&rgbSpectrumDensity);
  }
  else {
    v_01.n = (pointer)((long)CONCAT44(LeScale.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      LeScale.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                       (long)LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
    uVar2 = ny_00 * nx_00 * nz_00;
    if (v_01.n != (pointer)(long)(int)uVar2) {
      local_190.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
      rgbSpectrumDensity.
      super__Vector_base<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>.
      _M_impl.super__Vector_impl_data._M_start = v_01.n;
      ErrorExit<int&,int&,int&,int,unsigned_long>
                ("Expected %d x %d %d = %d values for \"Lescale\" but were given %d.",&nx,&ny,&nz,
                 (int *)&local_190,(unsigned_long *)&rgbSpectrumDensity);
    }
    for (uVar4 = 0; auVar12 = auVar9._8_56_, (~((int)uVar2 >> 0x1f) & uVar2) != uVar4;
        uVar4 = uVar4 + 1) {
      auVar9 = ZEXT464((uint)(local_1d8.memoryResource._0_4_ *
                             LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar4]));
      LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] =
           local_1d8.memoryResource._0_4_ *
           LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
           ._M_start[uVar4];
    }
    v_01.ptr = LeScale.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)&rgbSpectrumDensity,v_01,nx_00,ny_00,nz_00,alloc);
    SampledGrid<float>::operator=(&LeGrid,(SampledGrid<float> *)&rgbSpectrumDensity);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&rgbSpectrumDensity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rgbSpectrumDensity,"p0",(allocator<char> *)&local_60);
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  PVar13 = ParameterDictionary::GetOnePoint3f
                     (parameters,(string *)&rgbSpectrumDensity,(Point3f *)&local_50);
  local_190.super_Tuple3<pbrt::Point3,_float>.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar10._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  local_190.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar10._0_16_);
  std::__cxx11::string::~string((string *)&rgbSpectrumDensity);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rgbSpectrumDensity,"p1",&local_1d9);
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  auVar12 = ZEXT856(auVar8._8_8_);
  local_60._0_8_ = vmovlps_avx(auVar8);
  local_60.z = 1.0;
  PVar13 = ParameterDictionary::GetOnePoint3f
                     (parameters,(string *)&rgbSpectrumDensity,(Point3f *)&local_60);
  local_50.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar12;
  local_50._0_8_ = vmovlps_avx(auVar11._0_16_);
  std::__cxx11::string::~string((string *)&rgbSpectrumDensity);
  Bounds3<float>::Bounds3
            ((Bounds3<float> *)&rgbSpectrumDensity,&local_190,(Point3<float> *)&local_50);
  pUVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,(Bounds3<float> *)&rgbSpectrumDensity,&densityGrid,
                      &rgbDensityGrid,&colorSpace,&Le,&LeGrid,&alloc_local);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&LeScale.super__Vector_base<float,_std::allocator<float>_>);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&LeGrid.values);
  pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::~optional(&rgbDensityGrid);
  pstd::optional<pbrt::SampledGrid<float>_>::~optional(&densityGrid);
  std::_Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>::~_Vector_base
            (&rgbDensity.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&density.super__Vector_base<float,_std::allocator<float>_>);
  return pUVar3;
}

Assistant:

UniformGridMediumProvider *UniformGridMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::vector<Float> density = parameters.GetFloatArray("density");
    std::vector<RGB> rgbDensity = parameters.GetRGBArray("density");
    if (density.empty() && rgbDensity.empty())
        ErrorExit(loc, "No \"density\" values provided for uniform grid medium.");
    if (!density.empty() && !rgbDensity.empty())
        ErrorExit(loc, "Both \"float\" and \"rgb\" \"density\" values were provided.");

    int nx = parameters.GetOneInt("nx", 1);
    int ny = parameters.GetOneInt("ny", 1);
    int nz = parameters.GetOneInt("nz", 1);
    size_t nDensity = !density.empty() ? density.size() : rgbDensity.size();
    if (nDensity != nx * ny * nz)
        ErrorExit(loc,
                  "Uniform grid medium has %d density values; expected nx*ny*nz = %d",
                  nDensity, nx * ny * nz);

    const RGBColorSpace *colorSpace = parameters.ColorSpace();

    pstd::optional<SampledGrid<Float>> densityGrid;
    pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbDensityGrid;
    if (density.size())
        densityGrid = SampledGrid<Float>(density, nx, ny, nz, alloc);
    else {
        std::vector<RGBUnboundedSpectrum> rgbSpectrumDensity;
        for (RGB rgb : rgbDensity)
            rgbSpectrumDensity.push_back(RGBUnboundedSpectrum(*colorSpace, rgb));
        rgbDensityGrid =
            SampledGrid<RGBUnboundedSpectrum>(rgbSpectrumDensity, nx, ny, nz, alloc);
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeNorm = 1;
    if (Le == nullptr || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeNorm = 1 / SpectrumToPhotometric(Le);

    SampledGrid<Float> LeGrid(alloc);
    std::vector<Float> LeScale = parameters.GetFloatArray("Lescale");
    if (LeScale.empty())
        LeGrid = SampledGrid<Float>({LeNorm}, 1, 1, 1, alloc);
    else {
        if (LeScale.size() != nx * ny * nz)
            ErrorExit("Expected %d x %d %d = %d values for \"Lescale\" but were "
                      "given %d.",
                      nx, ny, nz, nx * ny * nz, LeScale.size());
        for (int i = 0; i < nx * ny * nz; ++i)
            LeScale[i] *= LeNorm;
        LeGrid = SampledGrid<Float>(LeScale, nx, ny, nz, alloc);
    }

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    return alloc.new_object<UniformGridMediumProvider>(
        Bounds3f(p0, p1), std::move(densityGrid), std::move(rgbDensityGrid), colorSpace,
        Le, std::move(LeGrid), alloc);
}